

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O1

void __thiscall
GrcErrorList::SetFileNameFromGdlFile(GrcErrorList *this,GrcManager *pcman,char *pchGdlFile)

{
  pointer pcVar1;
  int iVar2;
  size_t sVar3;
  string strErrFileName;
  long *local_40 [2];
  long local_30 [2];
  
  pcVar1 = (pcman->m_staErrorFileName)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (pcman->m_staErrorFileName)._M_string_length);
  iVar2 = std::__cxx11::string::find((char)(string *)local_40,0x5c);
  if (iVar2 == -1) {
    iVar2 = std::__cxx11::string::find((char)local_40,0x2f);
    if (iVar2 == -1) {
      for (sVar3 = strlen(pchGdlFile); (pchGdlFile[sVar3] != '/' && (pchGdlFile[sVar3] != '\\'));
          sVar3 = sVar3 - 1) {
        if (pchGdlFile + sVar3 <= pchGdlFile) {
          std::__cxx11::string::_M_assign((string *)&this->m_strErrFile);
          goto LAB_001631b8;
        }
      }
      std::__cxx11::string::_M_replace
                ((ulong)&this->m_strErrFile,0,(char *)(this->m_strErrFile)._M_string_length,
                 (ulong)pchGdlFile);
      std::__cxx11::string::_M_append((char *)&this->m_strErrFile,(ulong)local_40[0]);
      goto LAB_001631b8;
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->m_strErrFile);
LAB_001631b8:
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void GrcErrorList::SetFileNameFromGdlFile(GrcManager * pcman, char * pchGdlFile)
{
	std::string strErrFileName = pcman->ErrorFileName();
	int pos = (int)strErrFileName.find('\\');
	if (pos == -1)
		pos = (int)strErrFileName.find('/');
	if (pos != -1)
	{
		// path is indicated in the specified filename; don't change it
		m_strErrFile = strErrFileName;
		return;
	}

	char * pchEnd = pchGdlFile + strlen(pchGdlFile);
	while (*pchEnd != '\\' && *pchEnd != '/')
	{
		if (pchEnd <= pchGdlFile)
		{
			m_strErrFile = strErrFileName;  // GDL file has no path specified
			return;
		}
		pchEnd--;
	}
	m_strErrFile.assign(pchGdlFile, (pchEnd - pchGdlFile + 1));
	m_strErrFile.append(strErrFileName);
}